

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool re2::TopEqual(Regexp *a,Regexp *b)

{
  RegexpOp RVar1;
  RegexpOp RVar2;
  ParseFlags PVar3;
  ParseFlags PVar4;
  Rune RVar5;
  Rune RVar6;
  int iVar7;
  int iVar8;
  Rune *__s1;
  Rune *__s2;
  string *psVar9;
  string *psVar10;
  iterator pRVar11;
  iterator pRVar12;
  long lVar13;
  iterator pRVar14;
  iterator pRVar15;
  ostream *poVar16;
  Regexp *in_RSI;
  Regexp *in_RDI;
  CharClass *bcc;
  CharClass *acc;
  LogMessage *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  bool local_209;
  bool local_1f9;
  bool local_1d1;
  bool local_1c5;
  LogMessage local_1a8;
  CharClass *local_28;
  CharClass *local_20;
  Regexp *local_18;
  Regexp *local_10;
  bool local_1;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  RVar1 = Regexp::op(in_RDI);
  RVar2 = Regexp::op(local_18);
  if (RVar1 == RVar2) {
    RVar1 = Regexp::op(local_10);
    switch(RVar1) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpBeginText:
      local_1 = true;
      break;
    case kRegexpLiteral:
      RVar5 = Regexp::rune(local_10);
      RVar6 = Regexp::rune(local_18);
      local_1c5 = false;
      if (RVar5 == RVar6) {
        PVar3 = Regexp::parse_flags(local_10);
        PVar4 = Regexp::parse_flags(local_18);
        PVar3 = operator^(PVar3,PVar4);
        PVar3 = operator&(PVar3,FoldCase);
        local_1c5 = PVar3 == NoParseFlags;
      }
      local_1 = local_1c5;
      break;
    case kRegexpLiteralString:
      iVar7 = Regexp::nrunes(local_10);
      iVar8 = Regexp::nrunes(local_18);
      local_1d1 = false;
      if (iVar7 == iVar8) {
        PVar3 = Regexp::parse_flags(local_10);
        PVar4 = Regexp::parse_flags(local_18);
        PVar3 = operator^(PVar3,PVar4);
        PVar3 = operator&(PVar3,FoldCase);
        local_1d1 = false;
        if (PVar3 == NoParseFlags) {
          __s1 = Regexp::runes(local_10);
          __s2 = Regexp::runes(local_18);
          iVar7 = Regexp::nrunes(local_10);
          iVar7 = memcmp(__s1,__s2,(long)iVar7 << 2);
          local_1d1 = iVar7 == 0;
        }
      }
      local_1 = local_1d1;
      break;
    case kRegexpConcat:
    case kRegexpAlternate:
      iVar7 = Regexp::nsub(local_10);
      iVar8 = Regexp::nsub(local_18);
      local_1 = iVar7 == iVar8;
      break;
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      PVar3 = Regexp::parse_flags(local_10);
      PVar4 = Regexp::parse_flags(local_18);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,NonGreedy);
      local_1 = PVar3 == NoParseFlags;
      break;
    case kRegexpRepeat:
      PVar3 = Regexp::parse_flags(local_10);
      PVar4 = Regexp::parse_flags(local_18);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,NonGreedy);
      local_1f9 = false;
      if (PVar3 == NoParseFlags) {
        iVar7 = Regexp::min(local_10);
        iVar8 = Regexp::min(local_18);
        local_1f9 = false;
        if (iVar7 == iVar8) {
          iVar7 = Regexp::max(local_10);
          iVar8 = Regexp::max(local_18);
          local_1f9 = iVar7 == iVar8;
        }
      }
      local_1 = local_1f9;
      break;
    case kRegexpCapture:
      iVar7 = Regexp::cap(local_10);
      iVar8 = Regexp::cap(local_18);
      local_209 = false;
      if (iVar7 == iVar8) {
        psVar9 = Regexp::name_abi_cxx11_(local_10);
        psVar10 = Regexp::name_abi_cxx11_(local_18);
        local_209 = psVar9 == psVar10;
      }
      local_1 = local_209;
      break;
    case kRegexpEndText:
      PVar3 = Regexp::parse_flags(local_10);
      PVar4 = Regexp::parse_flags(local_18);
      PVar3 = operator^(PVar3,PVar4);
      PVar3 = operator&(PVar3,WasDollar);
      local_1 = PVar3 == NoParseFlags;
      break;
    case kRegexpCharClass:
      local_20 = Regexp::cc(local_10);
      local_28 = Regexp::cc(local_18);
      iVar7 = CharClass::size(local_20);
      iVar8 = CharClass::size(local_28);
      local_1 = false;
      if (iVar7 == iVar8) {
        pRVar11 = CharClass::end(local_20);
        pRVar12 = CharClass::begin(local_20);
        lVar13 = (long)pRVar11 - (long)pRVar12 >> 3;
        pRVar11 = CharClass::end(local_28);
        pRVar12 = CharClass::begin(local_28);
        local_1 = false;
        if (lVar13 == (long)pRVar11 - (long)pRVar12 >> 3) {
          pRVar11 = CharClass::begin(local_20);
          pRVar12 = CharClass::begin(local_28);
          pRVar14 = CharClass::end(local_20);
          pRVar15 = CharClass::begin(local_20);
          iVar7 = memcmp(pRVar11,pRVar12,((long)pRVar14 - (long)pRVar15 >> 3) << 3);
          local_1 = iVar7 == 0;
        }
      }
      break;
    case kMaxRegexpOp:
      iVar7 = Regexp::match_id(local_10);
      iVar8 = Regexp::match_id(local_18);
      local_1 = iVar7 == iVar8;
      break;
    default:
      LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar7);
      poVar16 = LogMessage::stream(&local_1a8);
      poVar16 = std::operator<<(poVar16,"Unexpected op in Regexp::Equal: ");
      RVar1 = Regexp::op(local_10);
      std::ostream::operator<<(poVar16,RVar1);
      LogMessage::~LogMessage(in_stack_fffffffffffffdb0);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool TopEqual(Regexp* a, Regexp* b) {
  if (a->op() != b->op())
    return false;

  switch (a->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpBeginText:
      return true;

    case kRegexpEndText:
      // The parse flags remember whether it's \z or (?-m:$),
      // which matters when testing against PCRE.
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::WasDollar) == 0;

    case kRegexpLiteral:
      return a->rune() == b->rune() &&
             ((a->parse_flags() ^ b->parse_flags()) & Regexp::FoldCase) == 0;

    case kRegexpLiteralString:
      return a->nrunes() == b->nrunes() &&
             ((a->parse_flags() ^ b->parse_flags()) & Regexp::FoldCase) == 0 &&
             memcmp(a->runes(), b->runes(),
                    a->nrunes() * sizeof a->runes()[0]) == 0;

    case kRegexpAlternate:
    case kRegexpConcat:
      return a->nsub() == b->nsub();

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::NonGreedy) == 0;

    case kRegexpRepeat:
      return ((a->parse_flags() ^ b->parse_flags()) & Regexp::NonGreedy) == 0 &&
             a->min() == b->min() &&
             a->max() == b->max();

    case kRegexpCapture:
      return a->cap() == b->cap() && a->name() == b->name();

    case kRegexpHaveMatch:
      return a->match_id() == b->match_id();

    case kRegexpCharClass: {
      CharClass* acc = a->cc();
      CharClass* bcc = b->cc();
      return acc->size() == bcc->size() &&
             acc->end() - acc->begin() == bcc->end() - bcc->begin() &&
             memcmp(acc->begin(), bcc->begin(),
                    (acc->end() - acc->begin()) * sizeof acc->begin()[0]) == 0;
    }
  }

  LOG(DFATAL) << "Unexpected op in Regexp::Equal: " << a->op();
  return 0;
}